

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionCodeGenJitTimeData.cpp
# Opt level: O2

bool __thiscall
Js::FunctionCodeGenJitTimeData::IsPolymorphicCallSite
          (FunctionCodeGenJitTimeData *this,ProfileId profiledCallSiteId)

{
  WriteBarrierPtr<Js::FunctionCodeGenJitTimeData> *pWVar1;
  code *pcVar2;
  bool bVar3;
  FunctionBody *pFVar4;
  undefined4 *puVar5;
  
  pFVar4 = GetFunctionBody(this);
  if (pFVar4 == (FunctionBody *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FunctionCodeGenJitTimeData.cpp"
                                ,0x4b,"(GetFunctionBody())","GetFunctionBody()");
    if (!bVar3) goto LAB_004140fa;
    *puVar5 = 0;
  }
  pFVar4 = GetFunctionBody(this);
  if (pFVar4->profiledCallSiteCount <= profiledCallSiteId) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FunctionCodeGenJitTimeData.cpp"
                                ,0x4c,
                                "(profiledCallSiteId < GetFunctionBody()->GetProfiledCallSiteCount())"
                                ,
                                "profiledCallSiteId < GetFunctionBody()->GetProfiledCallSiteCount()"
                               );
    if (!bVar3) {
LAB_004140fa:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  pWVar1 = (this->inlinees).ptr;
  if (pWVar1 == (WriteBarrierPtr<Js::FunctionCodeGenJitTimeData> *)0x0) {
    bVar3 = false;
  }
  else {
    bVar3 = ((pWVar1[profiledCallSiteId].ptr)->next).ptr != (FunctionCodeGenJitTimeData *)0x0;
  }
  return bVar3;
}

Assistant:

bool FunctionCodeGenJitTimeData::IsPolymorphicCallSite(const ProfileId profiledCallSiteId) const
    {
        Assert(GetFunctionBody());
        Assert(profiledCallSiteId < GetFunctionBody()->GetProfiledCallSiteCount());

        return inlinees ? inlinees[profiledCallSiteId]->next != nullptr : false;
    }